

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O1

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUIntASCII(BinaryStream *this,unsigned_long *position)

{
  byte bVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  byte bVar4;
  unsigned_long i;
  
  uVar3 = *position;
  *position = uVar3 + 1;
  uVar3 = (unsigned_long)(this->m_stream).m_buffer[uVar3];
  if (uVar3 == 0x7f) {
    uVar3 = 0x7f;
    bVar4 = 0;
    do {
      uVar2 = *position;
      *position = uVar2 + 1;
      bVar1 = (this->m_stream).m_buffer[uVar2];
      uVar3 = uVar3 + ((ulong)(bVar1 >> 1) << (bVar4 & 0x3f));
      bVar4 = bVar4 + 6;
    } while ((bVar1 & 1) != 0);
  }
  return uVar3;
}

Assistant:

unsigned long           ReadUIntASCII(unsigned long & position) const
                                {
                                    unsigned long value = m_stream[position++];
                                    if (value == O3DGC_BINARY_STREAM_MAX_SYMBOL0)
                                    {
                                        long x;
                                        unsigned long i = 0;
                                        do
                                        {
                                            x = m_stream[position++];
                                            value += ( (x>>1) << i);
                                            i += O3DGC_BINARY_STREAM_BITS_PER_SYMBOL1;
                                        } while (x & 1);
                                    }
                                    return value;
                                }